

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O2

void __thiscall net_uv::KCPServer::startFailureLogic(KCPServer *this)

{
  UVLoop *this_00;
  int __fd;
  
  (**(this->m_server->super_Socket)._vptr_Socket)();
  free(this->m_server);
  this->m_server = (KCPSocket *)0x0;
  this_00 = &(this->super_Server).super_Runnable.m_loop;
  __fd = 0;
  UVLoop::run(this_00,UV_RUN_DEFAULT);
  UVLoop::close(this_00,__fd);
  (this->super_Server).m_serverStage = STOP;
  return;
}

Assistant:

void KCPServer::startFailureLogic()
{
	m_server->~KCPSocket();
	fc_free(m_server);
	m_server = NULL;

	m_loop.run(UV_RUN_DEFAULT);
	m_loop.close();

	m_serverStage = ServerStage::STOP;
}